

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatform.cpp
# Opt level: O0

char * TimeStringImplementation(void)

{
  tm *__tp;
  tm *tmp;
  time_t theTime;
  
  tmp = (tm *)time((time_t *)0x0);
  __tp = localtime((time_t *)&tmp);
  strftime(TimeStringImplementation::dateTime,0x50,"%Y-%m-%dT%H:%M:%S",__tp);
  return TimeStringImplementation::dateTime;
}

Assistant:

static const char* TimeStringImplementation()
{
    time_t theTime = time(NULLPTR);
    static char dateTime[80];
#ifdef STDC_WANT_SECURE_LIB
    static struct tm lastlocaltime;
    localtime_s(&lastlocaltime, &theTime);
    struct tm *tmp = &lastlocaltime;
#else
    struct tm *tmp = localtime(&theTime);
#endif
    strftime(dateTime, 80, "%Y-%m-%dT%H:%M:%S", tmp);
    return dateTime;
}